

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

uint64_t __thiscall mkvmuxer::AudioTrack::PayloadSize(AudioTrack *this)

{
  uint64_t uVar1;
  uint64 uVar2;
  uint64 uVar3;
  
  uVar1 = Track::PayloadSize(&this->super_Track);
  uVar2 = EbmlElementSize(0xb5,(float)this->sample_rate_);
  uVar3 = EbmlElementSize(0x9f,this->channels_);
  uVar3 = uVar3 + uVar2;
  if (this->bit_depth_ != 0) {
    uVar2 = EbmlElementSize(0x6264,this->bit_depth_);
    uVar3 = uVar3 + uVar2;
  }
  uVar2 = EbmlMasterElementSize(0xe1,uVar3);
  return uVar2 + uVar1 + uVar3;
}

Assistant:

uint64_t AudioTrack::PayloadSize() const {
  const uint64_t parent_size = Track::PayloadSize();

  uint64_t size = EbmlElementSize(libwebm::kMkvSamplingFrequency,
                                  static_cast<float>(sample_rate_));
  size +=
      EbmlElementSize(libwebm::kMkvChannels, static_cast<uint64>(channels_));
  if (bit_depth_ > 0)
    size +=
        EbmlElementSize(libwebm::kMkvBitDepth, static_cast<uint64>(bit_depth_));
  size += EbmlMasterElementSize(libwebm::kMkvAudio, size);

  return parent_size + size;
}